

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3AddPrimaryKey(Parse *pParse,ExprList *pList,int onError,int autoInc,int sortOrder)

{
  uint uVar1;
  Table *pTVar2;
  char *zLeft;
  Column *pCVar3;
  ushort uVar4;
  int iVar5;
  Expr *pEVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  Column *local_58;
  
  pTVar2 = pParse->pNewTable;
  if (pTVar2 != (Table *)0x0) {
    if ((pTVar2->tabFlags & 4) == 0) {
      pTVar2->tabFlags = pTVar2->tabFlags | 4;
      if (pList == (ExprList *)0x0) {
        uVar7 = (long)pTVar2->nCol - 1;
        local_58 = pTVar2->aCol + uVar7;
        makeColumnPartOfPrimaryKey(pParse,local_58);
        bVar12 = true;
      }
      else {
        uVar1 = pList->nExpr;
        uVar10 = 0;
        if (0 < (int)uVar1) {
          uVar10 = (ulong)uVar1;
        }
        uVar7 = 0xffffffffffffffff;
        local_58 = (Column *)0x0;
        for (uVar8 = 0; uVar8 != uVar10; uVar8 = uVar8 + 1) {
          pEVar6 = sqlite3ExprSkipCollate(pList->a[uVar8].pExpr);
          sqlite3StringToId(pEVar6);
          if (pEVar6->op == ';') {
            uVar4 = pTVar2->nCol;
            if ((short)uVar4 < 1) {
              uVar4 = 0;
            }
            zLeft = (pEVar6->u).zToken;
            uVar7 = (ulong)uVar4;
            lVar11 = 0;
            for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
              pCVar3 = pTVar2->aCol;
              iVar5 = sqlite3StrICmp(zLeft,*(char **)((long)&pCVar3->zCnName + lVar11));
              if (iVar5 == 0) {
                local_58 = (Column *)((long)&pCVar3->zCnName + lVar11);
                makeColumnPartOfPrimaryKey(pParse,local_58);
                uVar7 = uVar9 & 0xffffffff;
                break;
              }
              lVar11 = lVar11 + 0x10;
            }
          }
        }
        bVar12 = uVar1 == 1;
      }
      if ((((bVar12) && (local_58 != (Column *)0x0)) && (sortOrder != 1)) &&
         ((local_58->field_0x8 & 0xf0) == 0x40)) {
        if ((pList != (ExprList *)0x0) && (1 < pParse->eParseMode)) {
          pEVar6 = sqlite3ExprSkipCollate(pList->a[0].pExpr);
          sqlite3RenameTokenRemap(pParse,&pTVar2->iPKey,pEVar6);
        }
        pTVar2->tabFlags = pTVar2->tabFlags | autoInc << 3;
        pTVar2->iPKey = (i16)uVar7;
        pTVar2->keyConf = (u8)onError;
        if (pList != (ExprList *)0x0) {
          pParse->iPkSortOrder = pList->a[0].fg.sortFlags;
        }
        sqlite3HasExplicitNulls(pParse,pList);
      }
      else if (autoInc == 0) {
        sqlite3CreateIndex(pParse,(Token *)0x0,(Token *)0x0,(SrcList *)0x0,pList,onError,
                           (Token *)0x0,(Expr *)0x0,sortOrder,0,'\x02');
        pList = (ExprList *)0x0;
      }
      else {
        sqlite3ErrorMsg(pParse,"AUTOINCREMENT is only allowed on an INTEGER PRIMARY KEY");
      }
    }
    else {
      sqlite3ErrorMsg(pParse,"table \"%s\" has more than one primary key",pTVar2->zName);
    }
  }
  sqlite3ExprListDelete(pParse->db,pList);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AddPrimaryKey(
  Parse *pParse,    /* Parsing context */
  ExprList *pList,  /* List of field names to be indexed */
  int onError,      /* What to do with a uniqueness conflict */
  int autoInc,      /* True if the AUTOINCREMENT keyword is present */
  int sortOrder     /* SQLITE_SO_ASC or SQLITE_SO_DESC */
){
  Table *pTab = pParse->pNewTable;
  Column *pCol = 0;
  int iCol = -1, i;
  int nTerm;
  if( pTab==0 ) goto primary_key_exit;
  if( pTab->tabFlags & TF_HasPrimaryKey ){
    sqlite3ErrorMsg(pParse,
      "table \"%s\" has more than one primary key", pTab->zName);
    goto primary_key_exit;
  }
  pTab->tabFlags |= TF_HasPrimaryKey;
  if( pList==0 ){
    iCol = pTab->nCol - 1;
    pCol = &pTab->aCol[iCol];
    makeColumnPartOfPrimaryKey(pParse, pCol);
    nTerm = 1;
  }else{
    nTerm = pList->nExpr;
    for(i=0; i<nTerm; i++){
      Expr *pCExpr = sqlite3ExprSkipCollate(pList->a[i].pExpr);
      assert( pCExpr!=0 );
      sqlite3StringToId(pCExpr);
      if( pCExpr->op==TK_ID ){
        const char *zCName;
        assert( !ExprHasProperty(pCExpr, EP_IntValue) );
        zCName = pCExpr->u.zToken;
        for(iCol=0; iCol<pTab->nCol; iCol++){
          if( sqlite3StrICmp(zCName, pTab->aCol[iCol].zCnName)==0 ){
            pCol = &pTab->aCol[iCol];
            makeColumnPartOfPrimaryKey(pParse, pCol);
            break;
          }
        }
      }
    }
  }
  if( nTerm==1
   && pCol
   && pCol->eCType==COLTYPE_INTEGER
   && sortOrder!=SQLITE_SO_DESC
  ){
    if( IN_RENAME_OBJECT && pList ){
      Expr *pCExpr = sqlite3ExprSkipCollate(pList->a[0].pExpr);
      sqlite3RenameTokenRemap(pParse, &pTab->iPKey, pCExpr);
    }
    pTab->iPKey = iCol;
    pTab->keyConf = (u8)onError;
    assert( autoInc==0 || autoInc==1 );
    pTab->tabFlags |= autoInc*TF_Autoincrement;
    if( pList ) pParse->iPkSortOrder = pList->a[0].fg.sortFlags;
    (void)sqlite3HasExplicitNulls(pParse, pList);
  }else if( autoInc ){
#ifndef SQLITE_OMIT_AUTOINCREMENT
    sqlite3ErrorMsg(pParse, "AUTOINCREMENT is only allowed on an "
       "INTEGER PRIMARY KEY");
#endif
  }else{
    sqlite3CreateIndex(pParse, 0, 0, 0, pList, onError, 0,
                           0, sortOrder, 0, SQLITE_IDXTYPE_PRIMARYKEY);
    pList = 0;
  }

primary_key_exit:
  sqlite3ExprListDelete(pParse->db, pList);
  return;
}